

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O2

objc_slot2 * objc_slot_lookup_super2(objc_super *super,SEL selector)

{
  Class poVar1;
  BOOL BVar2;
  dtable_t pSVar3;
  objc_slot2 *poVar4;
  Class poVar5;
  IMP p_Var6;
  Class object;
  uintptr_t addr;
  
  while( true ) {
    poVar1 = (Class)super->receiver;
    if (poVar1 == (Class)0x0) {
      return (objc_slot2 *)&nil_slot;
    }
    pSVar3 = dtable_for_class(super->class);
    poVar4 = (objc_slot2 *)SparseArrayLookup(pSVar3,*(uint32_t *)&selector->field_0);
    if (poVar4 != (objc_slot2 *)0x0) break;
    poVar5 = poVar1;
    if (((ulong)poVar1 & 7) != 0) {
      poVar5 = (Class)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)poVar1 & 7) << 3));
    }
    poVar5 = poVar5->isa;
    pSVar3 = dtable_for_class(poVar5);
    if (pSVar3 != uninstalled_dtable) {
      p_Var6 = (*__objc_msg_forward2)((id)poVar1,selector);
      poVar4 = (objc_slot2 *)__tls_get_addr(&PTR_00129f50);
      poVar4->method = p_Var6;
      return poVar4;
    }
    BVar2 = class_isMetaClass(poVar5);
    object = poVar5;
    if (BVar2 != '\0') {
      object = poVar1;
    }
    objc_send_initialize((id)object);
    objc_send_initialize((id)poVar5);
  }
  return poVar4;
}

Assistant:

struct objc_slot2 *objc_slot_lookup_super2(struct objc_super *super, SEL selector)
{
	id receiver = super->receiver;
	if (receiver)
	{
		Class class = super->class;
		struct objc_slot2 * result = objc_dtable_lookup(dtable_for_class(class),
				selector->index);
		if (0 == result)
		{
			Class class = classForObject(receiver);
			// Dtable should always be installed in the superclass in
			// Objective-C, but may not be for other languages (Python).
			if (dtable_for_class(class) == uninstalled_dtable)
			{
				if (class_isMetaClass(class))
				{
					objc_send_initialize(receiver);
				}
				else
				{
					objc_send_initialize((id)class);
				}
				objc_send_initialize((id)class);
				return objc_slot_lookup_super2(super, selector);
			}
			uncacheable_slot.imp = __objc_msg_forward2(receiver, selector);
			return (struct objc_slot2*)&uncacheable_slot;
		}
		return result;
	}
	return (struct objc_slot2*)&nil_slot;
}